

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

int __thiscall Js::ConcatStringBuilder::GetItemCount(ConcatStringBuilder *this)

{
  int count;
  int iVar1;
  
  iVar1 = 0;
  for (; this != (ConcatStringBuilder *)0x0; this = (this->m_prevChunk).ptr) {
    iVar1 = iVar1 + this->m_count;
  }
  return iVar1;
}

Assistant:

int ConcatStringBuilder::GetItemCount() const
    {
        int count = 0;
        const ConcatStringBuilder* current = this;
        while (current != NULL)
        {
            count += current->m_count;
            current = current->m_prevChunk;
        }
        return count;
    }